

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O3

void discrete_dist_test<trng::poisson_dist>(poisson_dist *d)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  bool bVar4;
  SourceLineInfo local_148;
  string local_138;
  SectionInfo local_118;
  Section local_c8;
  
  local_148.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
  ;
  local_148.line = 0x12d;
  paVar1 = &local_138.field_2;
  local_138._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"test pdf & cdf","");
  Catch::SectionInfo::SectionInfo(&local_118,&local_148,&local_138);
  Catch::Section::Section(&local_c8,&local_118);
  paVar2 = &local_118.description.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.description._M_dataplus._M_p != paVar2) {
    operator_delete(local_118.description._M_dataplus._M_p);
  }
  paVar3 = &local_118.name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.name._M_dataplus._M_p != paVar3) {
    operator_delete(local_118.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != paVar1) {
    operator_delete(local_138._M_dataplus._M_p);
  }
  bVar4 = Catch::Section::operator_cast_to_bool(&local_c8);
  if (bVar4) {
    discrete_dist_test_pdf<trng::poisson_dist>(d);
  }
  Catch::Section::~Section(&local_c8);
  local_148.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
  ;
  local_148.line = 0x130;
  local_138._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"chi2_test","");
  Catch::SectionInfo::SectionInfo(&local_118,&local_148,&local_138);
  Catch::Section::Section(&local_c8,&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.description._M_dataplus._M_p != paVar2) {
    operator_delete(local_118.description._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.name._M_dataplus._M_p != paVar3) {
    operator_delete(local_118.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != paVar1) {
    operator_delete(local_138._M_dataplus._M_p);
  }
  bVar4 = Catch::Section::operator_cast_to_bool(&local_c8);
  if (bVar4) {
    discrete_dist_test_chi2_test<trng::poisson_dist>(d);
  }
  Catch::Section::~Section(&local_c8);
  local_148.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
  ;
  local_148.line = 0x133;
  local_138._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"streamable","");
  Catch::SectionInfo::SectionInfo(&local_118,&local_148,&local_138);
  Catch::Section::Section(&local_c8,&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.description._M_dataplus._M_p != paVar2) {
    operator_delete(local_118.description._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.name._M_dataplus._M_p != paVar3) {
    operator_delete(local_118.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != paVar1) {
    operator_delete(local_138._M_dataplus._M_p);
  }
  bVar4 = Catch::Section::operator_cast_to_bool(&local_c8);
  if (bVar4) {
    discrete_dist_test_streamable<trng::poisson_dist>(d);
  }
  Catch::Section::~Section(&local_c8);
  return;
}

Assistant:

void discrete_dist_test(T &d) {
  SECTION("test pdf & cdf") {
    discrete_dist_test_pdf(d);
  }
  SECTION("chi2_test") {
    discrete_dist_test_chi2_test(d);
  }
  SECTION("streamable") {
    discrete_dist_test_streamable(d);
  }
}